

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Object * __thiscall symbols::StringObject::nextItem(StringObject *this)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  Object *pOVar4;
  ulong uVar5;
  
  iVar2 = this->iter_index;
  uVar5 = (ulong)iVar2;
  uVar3 = (this->value)._M_string_length;
  if (iVar2 < (int)uVar3) {
    pOVar4 = (Object *)operator_new(0x38);
    if (uVar3 <= uVar5) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar3);
    }
    cVar1 = (this->value)._M_dataplus._M_p[uVar5];
    pOVar4->_type = STRINGTYPE;
    pOVar4->_vptr_Object = (_func_int **)&PTR_type_00179ce0;
    pOVar4[1]._vptr_Object = (_func_int **)(pOVar4 + 2);
    *(char *)&pOVar4[2]._vptr_Object = cVar1;
    *(undefined1 *)((long)&pOVar4[2]._vptr_Object + 1) = 0;
    *(undefined8 *)&pOVar4[1]._type = 1;
    *(undefined4 *)&pOVar4[3]._vptr_Object = 0;
    this->iter_index = iVar2 + 1;
  }
  else {
    pOVar4 = (Object *)operator_new(0x10);
    pOVar4->_type = NULLTYPE;
    pOVar4->_vptr_Object = (_func_int **)&PTR_type_00179b70;
  }
  return pOVar4;
}

Assistant:

Object* StringObject::nextItem()
{
    if(this->iter_index >= (int)this->value.size()){
        return new NullObject();
    }
    auto curStr = new StringObject(std::string(1, this->value.at(this->iter_index)));
    this->iter_index++;
    return curStr;
}